

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O3

SUNErrCode SUNMatSpace_Sparse(SUNMatrix A,long *lenrw,long *leniw)

{
  void *pvVar1;
  long lVar2;
  
  pvVar1 = A->content;
  lVar2 = *(long *)((long)pvVar1 + 0x10);
  *lenrw = lVar2;
  *leniw = *(long *)((long)pvVar1 + 0x18) + lVar2 + 10;
  return 0;
}

Assistant:

SUNErrCode SUNMatSpace_Sparse(SUNMatrix A, long int* lenrw, long int* leniw)
{
  SUNFunctionBegin(A->sunctx);
  SUNAssert(SUNMatGetID(A) == SUNMATRIX_SPARSE, SUN_ERR_ARG_WRONGTYPE);
  SUNAssert(lenrw, SUN_ERR_ARG_CORRUPT);
  SUNAssert(leniw, SUN_ERR_ARG_CORRUPT);
  *lenrw = SM_NNZ_S(A);
  *leniw = 10 + SM_NP_S(A) + SM_NNZ_S(A);
  return SUN_SUCCESS;
}